

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapProxyInfo(SnapObject *snpObject,InflateMap *inflator)

{
  TTD_PTR_ID *pTVar1;
  TTD_PTR_ID TVar2;
  ScriptContext *pSVar3;
  RecyclableObject *pRVar4;
  RecyclableObject *target;
  
  pSVar3 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag == SnapProxyObject) {
    pTVar1 = (TTD_PTR_ID *)snpObject->AddtlSnapObjectInfo;
    TVar2 = *pTVar1;
    if (TVar2 == 0) {
      pRVar4 = (RecyclableObject *)0x0;
    }
    else {
      pRVar4 = InflateMap::LookupObject(inflator,TVar2);
    }
    TVar2 = pTVar1[1];
    if (TVar2 == 0) {
      target = (RecyclableObject *)0x0;
    }
    else {
      target = InflateMap::LookupObject(inflator,TVar2);
    }
    pRVar4 = Js::JavascriptLibrary::CreateProxy_TTD
                       ((pSVar3->super_ScriptContextBase).javascriptLibrary,pRVar4,target);
    return pRVar4;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapProxyInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            SnapProxyInfo* proxyInfo = SnapObjectGetAddtlInfoAs<SnapProxyInfo*, SnapObjectType::SnapProxyObject>(snpObject);

            Js::RecyclableObject* handlerObj = (proxyInfo->HandlerId != TTD_INVALID_PTR_ID) ? inflator->LookupObject(proxyInfo->HandlerId) : nullptr;
            Js::RecyclableObject* targetObj = (proxyInfo->TargetId != TTD_INVALID_PTR_ID) ? inflator->LookupObject(proxyInfo->TargetId) : nullptr;

            return  ctx->GetLibrary()->CreateProxy_TTD(handlerObj, targetObj);
        }